

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.cc
# Opt level: O0

SinLayerParams * __thiscall
CoreML::Specification::SinLayerParams::New(SinLayerParams *this,Arena *arena)

{
  SinLayerParams *this_00;
  SinLayerParams *n;
  Arena *arena_local;
  SinLayerParams *this_local;
  
  this_00 = (SinLayerParams *)operator_new(0x18);
  SinLayerParams(this_00);
  if (arena != (Arena *)0x0) {
    google::protobuf::Arena::Own<CoreML::Specification::SinLayerParams>(arena,this_00);
  }
  return this_00;
}

Assistant:

SinLayerParams* SinLayerParams::New(::google::protobuf::Arena* arena) const {
  SinLayerParams* n = new SinLayerParams;
  if (arena != NULL) {
    arena->Own(n);
  }
  return n;
}